

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

bool __thiscall pbrt::Image::WritePNG(Image *this,string *name,ImageMetadata *metadata)

{
  ushort uVar1;
  int iVar2;
  undefined8 uVar3;
  uchar uVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  Image *pIVar8;
  uint uVar9;
  ulong uVar10;
  Point2i p;
  long lVar11;
  ushort *puVar12;
  uint uVar13;
  long lVar14;
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int nOutOfGamut;
  string ret;
  int local_9c;
  uchar *local_98;
  int local_8c;
  Image *local_88;
  string local_80;
  string *local_60;
  long local_58;
  ulong local_50;
  undefined1 *local_48;
  ulong local_40;
  char *local_38;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  local_8c = 0;
  iVar2 = (int)(this->channelNames).nStored;
  if (this->format == U256) {
    if (iVar2 == 3) {
      uVar6 = lodepng_encode24_file
                        ((name->_M_dataplus)._M_p,(this->p8).ptr,
                         (this->resolution).super_Tuple2<pbrt::Point2,_int>.x,
                         (this->resolution).super_Tuple2<pbrt::Point2,_int>.y);
    }
    else {
      if (iVar2 != 1) {
        local_80._M_dataplus._M_p._0_4_ = iVar2;
        LogFatal<int>(Fatal,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
                      ,0x569,"Unhandled channel count in WritePNG(): %d",(int *)&local_80);
      }
      uVar6 = lodepng_encode_file((name->_M_dataplus)._M_p,(this->p8).ptr,
                                  (this->resolution).super_Tuple2<pbrt::Point2,_int>.x,
                                  (this->resolution).super_Tuple2<pbrt::Point2,_int>.y,LCT_GREY,8);
    }
  }
  else {
    local_88 = this;
    local_60 = name;
    if (iVar2 == 1) {
      uVar6 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
      uVar13 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
      uVar10 = (ulong)uVar13;
      local_98 = (uchar *)operator_new__((long)(int)(uVar6 * uVar13));
      memset(local_98,0,(long)(int)(uVar6 * uVar13));
      if ((int)uVar6 < 1) {
        local_9c = 0;
      }
      else {
        lVar11 = 0;
        local_9c = 0;
        lVar7 = 0;
        pIVar8 = local_88;
        do {
          if (0 < (int)uVar10) {
            lVar14 = 0;
            do {
              uVar1 = *(ushort *)
                       (BlueNoiseTextures +
                       (ulong)((uint)lVar7 & 0x7f) * 2 + (ulong)(((uint)lVar14 & 0x7f) << 8));
              auVar16._0_4_ =
                   GetChannel(pIVar8,(Point2i)(lVar11 + lVar14),0,(WrapMode2D)0x200000002);
              auVar16._4_60_ = extraout_var_00;
              if ((auVar16._0_4_ < 0.0) || (1.0 < auVar16._0_4_)) {
                local_9c = local_9c + 1;
                local_8c = local_9c;
              }
              if (auVar16._0_4_ <= 0.0) {
                uVar4 = '\0';
              }
              else {
                uVar4 = 0xff;
                if (auVar16._0_4_ < 1.0) {
                  uVar6 = (uint)(auVar16._0_4_ * 256.0);
                  if ((int)uVar6 < 0) {
                    auVar18._0_12_ = ZEXT812(0);
                    auVar18._12_4_ = 0;
                  }
                  else {
                    auVar18 = SUB6416(ZEXT464(0x3f800000),0);
                    if (uVar6 < 0x100) {
                      auVar18 = vfmadd213ss_fma(ZEXT416(*(uint *)(LinearToSRGBPiecewise +
                                                                 (ulong)uVar6 * 8 + 4)),
                                                auVar16._0_16_,
                                                ZEXT416(*(uint *)(LinearToSRGBPiecewise +
                                                                 (ulong)uVar6 * 8)));
                    }
                  }
                  auVar17 = vfmadd213ss_fma(auVar18,SUB6416(ZEXT464(0x437f0000),0),
                                            ZEXT416((uint)((float)uVar1 / 65535.0 + -0.5)));
                  auVar18 = vminss_avx(SUB6416(ZEXT464(0x437f0000),0),auVar17);
                  uVar3 = vcmpss_avx512f(auVar17,ZEXT816(0) << 0x40,1);
                  uVar4 = (uchar)(int)(float)((uint)!(bool)((byte)uVar3 & 1) * auVar18._0_4_);
                }
              }
              iVar2 = (local_88->resolution).super_Tuple2<pbrt::Point2,_int>.x;
              uVar10 = (ulong)iVar2;
              local_98[lVar14 + (int)((uint)lVar7 * iVar2)] = uVar4;
              lVar14 = lVar14 + 1;
              pIVar8 = local_88;
            } while (lVar14 < (long)uVar10);
            uVar6 = (local_88->resolution).super_Tuple2<pbrt::Point2,_int>.y;
          }
          uVar13 = (uint)uVar10;
          lVar7 = lVar7 + 1;
          lVar11 = lVar11 + 0x100000000;
        } while (lVar7 < (int)uVar6);
      }
      name = local_60;
      uVar6 = lodepng_encode_file((local_60->_M_dataplus)._M_p,local_98,uVar13,uVar6,LCT_GREY,8);
    }
    else {
      if (iVar2 != 3) {
        return true;
      }
      uVar6 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
      uVar13 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
      uVar10 = (ulong)(int)(uVar6 * uVar13 * 3);
      local_98 = (uchar *)operator_new__(uVar10);
      memset(local_98,0,uVar10);
      if ((int)uVar13 < 1) {
        local_9c = 0;
      }
      else {
        uVar9 = 0;
        lVar7 = 0;
        local_9c = 0;
        pIVar8 = local_88;
        do {
          if (0 < (int)uVar6) {
            local_50 = lVar7 << 0x20;
            uVar13 = 0;
            local_48 = BlueNoiseTextures + (uVar9 & 0x7f) * 2;
            uVar10 = 0;
            local_58 = lVar7;
            do {
              lVar7 = 0;
              puVar12 = (ushort *)(local_48 + ((uVar13 & 0x7f) << 8));
              p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_50 | uVar10);
              local_40 = uVar10;
              do {
                uVar1 = *puVar12;
                auVar15._0_4_ = GetChannel(pIVar8,p,(int)lVar7,(WrapMode2D)0x200000002);
                auVar15._4_60_ = extraout_var;
                if ((auVar15._0_4_ < 0.0) || (1.0 < auVar15._0_4_)) {
                  local_9c = local_9c + 1;
                  local_8c = local_9c;
                }
                if (auVar15._0_4_ <= 0.0) {
                  uVar4 = '\0';
                }
                else {
                  uVar4 = 0xff;
                  if (auVar15._0_4_ < 1.0) {
                    uVar6 = (uint)(auVar15._0_4_ * 256.0);
                    if ((int)uVar6 < 0) {
                      auVar17._0_12_ = ZEXT812(0);
                      auVar17._12_4_ = 0;
                    }
                    else {
                      auVar17 = SUB6416(ZEXT464(0x3f800000),0);
                      if (uVar6 < 0x100) {
                        auVar17 = vfmadd213ss_fma(ZEXT416(*(uint *)(LinearToSRGBPiecewise +
                                                                   (ulong)uVar6 * 8 + 4)),
                                                  auVar15._0_16_,
                                                  ZEXT416(*(uint *)(LinearToSRGBPiecewise +
                                                                   (ulong)uVar6 * 8)));
                      }
                    }
                    auVar17 = vfmadd213ss_fma(auVar17,SUB6416(ZEXT464(0x437f0000),0),
                                              ZEXT416((uint)((float)uVar1 / 65535.0 + -0.5)));
                    auVar18 = vminss_avx(SUB6416(ZEXT464(0x437f0000),0),auVar17);
                    uVar3 = vcmpss_avx512f(auVar17,ZEXT816(0) << 0x40,1);
                    uVar4 = (uchar)(int)(float)((uint)!(bool)((byte)uVar3 & 1) * auVar18._0_4_);
                  }
                }
                uVar6 = (local_88->resolution).super_Tuple2<pbrt::Point2,_int>.x;
                puVar12 = puVar12 + 0x4000;
                local_98[lVar7 + (long)(int)(uVar9 * uVar6 + uVar13) * 3] = uVar4;
                lVar7 = lVar7 + 1;
                pIVar8 = local_88;
              } while (lVar7 != 3);
              uVar13 = uVar13 + 1;
              uVar10 = local_40 + 1;
            } while ((long)uVar10 < (long)(int)uVar6);
            uVar13 = (local_88->resolution).super_Tuple2<pbrt::Point2,_int>.y;
            lVar7 = local_58;
          }
          lVar7 = lVar7 + 1;
          uVar9 = uVar9 + 1;
        } while (lVar7 < (int)uVar13);
      }
      name = local_60;
      uVar6 = lodepng_encode24_file((local_60->_M_dataplus)._M_p,local_98,uVar6,uVar13);
    }
    operator_delete__(local_98);
    if (0 < local_9c) {
      local_80._M_string_length = 0;
      local_80.field_2._M_local_buf[0] = '\0';
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      detail::stringPrintfRecursive<std::__cxx11::string_const&,int&>
                (&local_80,"%s: %d out of gamut pixel channels clamped to [0,1].",name,&local_8c);
      Warning((FileLoc *)0x0,local_80._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,
                        CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                 local_80.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  if (uVar6 == 0) {
    bVar5 = true;
  }
  else {
    local_38 = lodepng_error_text(uVar6);
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = '\0';
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    detail::stringPrintfRecursive<std::__cxx11::string_const&,char_const*>
              (&local_80,"Error writing PNG \"%s\": %s",name,&local_38);
    Error((FileLoc *)0x0,local_80._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,
                      CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                               local_80.field_2._M_local_buf[0]) + 1);
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool Image::WritePNG(const std::string &name, const ImageMetadata &metadata) const {
    unsigned int error = 0;
    int nOutOfGamut = 0;

    if (format == PixelFormat::U256) {
        if (NChannels() == 1)
            error = lodepng_encode_file(name.c_str(), p8.data(), resolution.x,
                                        resolution.y, LCT_GREY, 8 /* bitdepth */);
        else if (NChannels() == 3)
            // TODO: it would be nice to store the color encoding used in the
            // PNG metadata...
            error = lodepng_encode24_file(name.c_str(), p8.data(), resolution.x,
                                          resolution.y);
        else
            LOG_FATAL("Unhandled channel count in WritePNG(): %d", NChannels());
    } else if (NChannels() == 3) {
        // It may not actually be RGB, but that's what PNG's going to
        // assume..
        std::unique_ptr<uint8_t[]> rgb8 =
            std::make_unique<uint8_t[]>(3 * resolution.x * resolution.y);
        for (int y = 0; y < resolution.y; ++y)
            for (int x = 0; x < resolution.x; ++x)
                for (int c = 0; c < 3; ++c) {
                    Float dither = -.5f + BlueNoise(c, x, y);
                    Float v = GetChannel({x, y}, c);
                    if (v < 0 || v > 1)
                        ++nOutOfGamut;
                    rgb8[3 * (y * resolution.x + x) + c] = LinearToSRGB8(v, dither);
                }

        error =
            lodepng_encode24_file(name.c_str(), rgb8.get(), resolution.x, resolution.y);
    } else if (NChannels() == 1) {
        std::unique_ptr<uint8_t[]> y8 =
            std::make_unique<uint8_t[]>(resolution.x * resolution.y);
        for (int y = 0; y < resolution.y; ++y)
            for (int x = 0; x < resolution.x; ++x) {
                Float dither = -.5f + BlueNoise(0, x, y);
                Float v = GetChannel({x, y}, 0);
                if (v < 0 || v > 1)
                    ++nOutOfGamut;
                y8[y * resolution.x + x] = LinearToSRGB8(v, dither);
            }

        error = lodepng_encode_file(name.c_str(), y8.get(), resolution.x, resolution.y,
                                    LCT_GREY, 8 /* bitdepth */);
    }

    if (nOutOfGamut > 0)
        Warning("%s: %d out of gamut pixel channels clamped to [0,1].", name,
                nOutOfGamut);

    if (error != 0) {
        Error("Error writing PNG \"%s\": %s", name, lodepng_error_text(error));
        return false;
    }
    return true;
}